

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<int,QByteArray>::insertOrAssign_impl<int_const&,QByteArray_const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<int,QByteArray> *this,int *key,
          QByteArray *value)

{
  ulong uVar1;
  Span *pSVar2;
  ulong uVar3;
  
  *(undefined1 **)&__return_storage_ptr__->inserted = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->iterator).i.d =
       (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->iterator).i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  tryEmplace_impl<int_const&,QByteArray_const&>(__return_storage_ptr__,this,key,value);
  if (__return_storage_ptr__->inserted == false) {
    uVar1 = (__return_storage_ptr__->iterator).i.bucket;
    pSVar2 = ((__return_storage_ptr__->iterator).i.d)->spans;
    uVar3 = uVar1 >> 7;
    QByteArray::operator=
              ((QByteArray *)
               (((pSVar2[uVar3].entries)->storage).data +
               (ulong)pSVar2[uVar3].offsets[(uint)uVar1 & 0x7f] * 0x20 + 8),value);
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult insertOrAssign_impl(K &&key, Value &&value)
    {
        auto r = tryEmplace(std::forward<K>(key), std::forward<Value>(value));
        if (!r.inserted)
            *r.iterator = std::forward<Value>(value); // `value` is untouched if we get here
        return r;
    }